

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas0.cpp
# Opt level: O2

void r4mat_print_some(int m,int n,float *a,int ilo,int jlo,int ihi,int jhi,string *title)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  float *pfVar8;
  float *pfVar9;
  ulong uVar10;
  float *local_60;
  
  std::operator<<((ostream *)&std::cout,"\n");
  poVar4 = std::operator<<((ostream *)&std::cout,(string *)title);
  std::operator<<(poVar4,"\n");
  if (n < 1 || m < 1) {
    std::operator<<((ostream *)&std::cout,"\n");
    std::operator<<((ostream *)&std::cout,"  (None)\n");
    return;
  }
  uVar7 = (ulong)jlo;
  uVar10 = (ulong)(uint)m;
  local_60 = a + (uVar7 - 1) * uVar10 + -1;
  for (; (int)uVar7 <= jhi; uVar7 = uVar7 + 5) {
    iVar1 = i4_min((int)uVar7 + 4,n);
    iVar1 = i4_min(iVar1,jhi);
    std::operator<<((ostream *)&std::cout,"\n");
    std::operator<<((ostream *)&std::cout,"  Col:    ");
    uVar6 = uVar7 & 0xffffffff;
    while (iVar2 = (int)uVar6, iVar2 <= iVar1) {
      *(undefined8 *)(fesetround + *(long *)(std::cout + -0x18)) = 7;
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2 + -1);
      std::operator<<(poVar4,"       ");
      uVar6 = (ulong)(iVar2 + 1);
    }
    std::operator<<((ostream *)&std::cout,"\n");
    std::operator<<((ostream *)&std::cout,"  Row\n");
    std::operator<<((ostream *)&std::cout,"\n");
    iVar2 = i4_max(ilo,1);
    iVar3 = i4_min(ihi,m);
    lVar5 = (long)iVar2;
    pfVar8 = local_60 + lVar5;
    for (; lVar5 <= iVar3; lVar5 = lVar5 + 1) {
      *(undefined8 *)(fesetround + *(long *)(std::cout + -0x18)) = 5;
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar5 + -1);
      std::operator<<(poVar4,": ");
      pfVar9 = pfVar8;
      for (uVar6 = uVar7; (long)uVar6 <= (long)iVar1; uVar6 = uVar6 + 1) {
        *(undefined8 *)(fesetround + *(long *)(std::cout + -0x18)) = 0xc;
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pfVar9);
        std::operator<<(poVar4,"  ");
        pfVar9 = pfVar9 + uVar10;
      }
      std::operator<<((ostream *)&std::cout,"\n");
      pfVar8 = pfVar8 + 1;
    }
    local_60 = local_60 + uVar10 * 5;
  }
  return;
}

Assistant:

void r4mat_print_some ( int m, int n, float a[], int ilo, int jlo, int ihi,
  int jhi, string title )

//****************************************************************************80
//
//  Purpose:
//
//    R4MAT_PRINT_SOME prints some of an R4MAT.
//
//  Discussion:
//
//    An R4MAT is a doubly dimensioned array of R4 values, stored as a vector
//    in column-major order.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    20 August 2010
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int M, the number of rows of the matrix.
//    M must be positive.
//
//    Input, int N, the number of columns of the matrix.
//    N must be positive.
//
//    Input, float A[M*N], the matrix.
//
//    Input, int ILO, JLO, IHI, JHI, designate the first row and
//    column, and the last row and column to be printed.
//
//    Input, string TITLE, a title.
//
{
# define INCX 5

  int i;
  int i2hi;
  int i2lo;
  int j;
  int j2hi;
  int j2lo;

  cout << "\n";
  cout << title << "\n";

  if ( m <= 0 || n <= 0 )
  {
    cout << "\n";
    cout << "  (None)\n";
    return;
  }
//
//  Print the columns of the matrix, in strips of 5.
//
  for ( j2lo = jlo; j2lo <= jhi; j2lo = j2lo + INCX )
  {
    j2hi = j2lo + INCX - 1;
    j2hi = i4_min ( j2hi, n );
    j2hi = i4_min ( j2hi, jhi );

    cout << "\n";
//
//  For each column J in the current range...
//
//  Write the header.
//
    cout << "  Col:    ";
    for ( j = j2lo; j <= j2hi; j++ )
    {
      cout << setw(7) << j - 1 << "       ";
    }
    cout << "\n";
    cout << "  Row\n";
    cout << "\n";
//
//  Determine the range of the rows in this strip.
//
    i2lo = i4_max ( ilo, 1 );
    i2hi = i4_min ( ihi, m );

    for ( i = i2lo; i <= i2hi; i++ )
    {
//
//  Print out (up to) 5 entries in row I, that lie in the current strip.
//
      cout << setw(5) << i - 1 << ": ";
      for ( j = j2lo; j <= j2hi; j++ )
      {
        cout << setw(12) << a[i-1+(j-1)*m] << "  ";
      }
      cout << "\n";
    }
  }

  return;
# undef INCX
}